

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O1

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::Consolidate
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this)

{
  uint **ppuVar1;
  uint *puVar2;
  uint *puVar3;
  ulong uVar4;
  uint j;
  long lVar5;
  uint uVar6;
  
  if (0xf < this->maxIndex) {
    ppuVar1 = this->backingStore;
    uVar4 = 0;
    do {
      puVar2 = ppuVar1[uVar4];
      if (puVar2 != (uint *)0x0) {
        lVar5 = 0;
        do {
          uVar6 = puVar2[lVar5];
          if ((uVar6 < this->maxIndex) && (puVar3 = ppuVar1[uVar6 >> 4], puVar3 != (uint *)0x0)) {
            uVar6 = puVar3[uVar6 & 0xf];
          }
          puVar2[lVar5] = uVar6;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x10);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->maxIndex >> 4);
  }
  this->consolidated = true;
  return;
}

Assistant:

void Consolidate()
    {
        for (indexType i = 0; i < maxIndex / numPerSegment; i++)
        {
            if (backingStore[i] != nullptr)
            {
                for (indexType j = 0; j < numPerSegment; j++)
                {
                    // We can assumeConsolidated here because everything less than the current index is consolidated
                    backingStore[i][j] = Lookup<false, true>(backingStore[i][j]);
                }
            }
        }
#if DBG
        consolidated = true;
#endif
    }